

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ErrorWithMsg(sqlite3 *db,int err_code,char *zFormat,...)

{
  _func_int_sqlite3_vfs_ptr_int_char_ptr *p_Var1;
  char in_AL;
  int iVar2;
  sqlite3_value *psVar3;
  char *z;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  db->errCode = err_code;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if ((err_code & 0xfbU) == 10 && err_code != 0xc0a) {
    p_Var1 = db->pVfs->xGetLastError;
    if (p_Var1 == (_func_int_sqlite3_vfs_ptr_int_char_ptr *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = (*p_Var1)(db->pVfs,0,(char *)0x0);
    }
    db->iSysErrno = iVar2;
  }
  if (zFormat == (char *)0x0) {
    db->errCode = err_code;
    if ((err_code != 0) || (db->pErr != (sqlite3_value *)0x0)) {
      sqlite3ErrorFinish(db,err_code);
      return;
    }
    db->errByteOffset = -1;
  }
  else {
    if (db->pErr == (sqlite3_value *)0x0) {
      psVar3 = (sqlite3_value *)sqlite3DbMallocZero(db,0x38);
      if (psVar3 == (sqlite3_value *)0x0) {
        db->pErr = (sqlite3_value *)0x0;
        return;
      }
      psVar3->flags = 1;
      psVar3->db = db;
      db->pErr = psVar3;
    }
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_e8.gp_offset = 0x18;
    local_e8.fp_offset = 0x30;
    z = sqlite3VMPrintf(db,zFormat,&local_e8);
    if (db->pErr != (Mem *)0x0) {
      sqlite3VdbeMemSetStr(db->pErr,z,-1,'\x01',sqlite3OomClear);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ErrorWithMsg(sqlite3 *db, int err_code, const char *zFormat, ...){
  assert( db!=0 );
  db->errCode = err_code;
  sqlite3SystemError(db, err_code);
  if( zFormat==0 ){
    sqlite3Error(db, err_code);
  }else if( db->pErr || (db->pErr = sqlite3ValueNew(db))!=0 ){
    char *z;
    va_list ap;
    va_start(ap, zFormat);
    z = sqlite3VMPrintf(db, zFormat, ap);
    va_end(ap);
    sqlite3ValueSetStr(db->pErr, -1, z, SQLITE_UTF8, SQLITE_DYNAMIC);
  }
}